

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_data_stream.cpp
# Opt level: O2

bool __thiscall crnlib::data_stream::read_line(data_stream *this,dynamic_string *str)

{
  byte bVar1;
  int iVar2;
  
  dynamic_string::empty(str);
  while( true ) {
    do {
      while( true ) {
        do {
          iVar2 = read_byte(this);
          bVar1 = this->field_0x1a;
          this->field_0x1a = bVar1 & 0xfb;
          if (iVar2 < 0) {
            if (str->m_len != 0) {
              return true;
            }
            return false;
          }
        } while (iVar2 == 0);
        if (iVar2 != 10) break;
        if ((bVar1 & 4) == 0) {
          return true;
        }
      }
    } while (iVar2 == 0x1a);
    if (iVar2 == 0xd) break;
    dynamic_string::append_char(str,(char)iVar2);
  }
  this->field_0x1a = bVar1 | 4;
  return true;
}

Assistant:

bool data_stream::read_line(dynamic_string& str) {
  str.empty();

  for (;;) {
    const int c = read_byte();

    const bool prev_got_cr = m_got_cr;
    m_got_cr = false;

    if (c < 0) {
      if (!str.is_empty())
        break;

      return false;
    } else if ((26 == c) || (!c))
      continue;
    else if (13 == c) {
      m_got_cr = true;
      break;
    } else if (10 == c) {
      if (prev_got_cr)
        continue;

      break;
    }

    str.append_char(static_cast<char>(c));
  }

  return true;
}